

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RoundLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_round(NeuralNetworkLayer *this)

{
  bool bVar1;
  RoundLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_round(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_round(this);
    this_00 = (RoundLayerParams *)operator_new(0x18);
    RoundLayerParams::RoundLayerParams(this_00);
    (this->layer_).round_ = this_00;
  }
  return (RoundLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RoundLayerParams* NeuralNetworkLayer::mutable_round() {
  if (!has_round()) {
    clear_layer();
    set_has_round();
    layer_.round_ = new ::CoreML::Specification::RoundLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.round)
  return layer_.round_;
}